

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> * __thiscall
wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
add<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
          (FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *this,
          FeatureSet feature,WeightedOption weightedOption,
          offset_in_TranslateToFuzzReader_to_subr rest)

{
  mapped_type *this_00;
  FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *pFVar1;
  size_t i;
  ulong uVar2;
  FeatureSet local_34 [2];
  FeatureSet feature_local;
  
  local_34[0].features = feature.features;
  for (uVar2 = 0; uVar2 < weightedOption.weight; uVar2 = uVar2 + 1) {
    this_00 = std::
              map<wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>_>
              ::operator[]((map<wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>_>_>_>
                            *)this,local_34);
    std::
    vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>
    ::push_back(this_00,&weightedOption.option);
  }
  pFVar1 = FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
                     ((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                       *)this,local_34[0],rest);
  return pFVar1;
}

Assistant:

FeatureOptions<T>&
    add(FeatureSet feature, WeightedOption weightedOption, Ts... rest) {
      for (size_t i = 0; i < weightedOption.weight; i++) {
        options[feature].push_back(weightedOption.option);
      }
      return add(feature, rest...);
    }